

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mockaron.hpp
# Opt level: O2

void __thiscall
mockaron::detail::any::set<std::function<char_const*(int,char)>>
          (any *this,function<const_char_*(int,_char)> *v)

{
  function<const_char_*(int,_char)> *this_00;
  anon_class_1_0_00000001 local_19;
  
  this_00 = (function<const_char_*(int,_char)> *)operator_new(0x20);
  std::function<const_char_*(int,_char)>::function(this_00,v);
  this->_ptr = this_00;
  std::function<void(void*)>::operator=((function<void(void*)> *)&this->_deleter,&local_19);
  return;
}

Assistant:

void set(T&& v)
  {
    _ptr = new std::decay_t<T>(std::forward<T>(v));
    _deleter = [](void* ptr) { delete static_cast<T*>(ptr); };
  }